

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

jint Java_fr_limsi_wapiti_WapitiJNI_runWapiti(JNIEnv *jenv,jclass jcls,jstring jarg1)

{
  long in_RDX;
  char *e;
  char *e_1;
  int result;
  char *arg1;
  jint jresult;
  char *in_stack_000021b0;
  jstring in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  char *local_30;
  int local_4;
  
  local_30 = (char *)0x0;
  if ((in_RDX == 0) ||
     (local_30 = JNIEnv_::GetStringUTFChars
                           ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                            ,in_stack_ffffffffffffff98,(jboolean *)0x11bae8),
     local_30 != (char *)0x0)) {
    local_4 = runWapiti(in_stack_000021b0);
    if (local_30 != (char *)0x0) {
      JNIEnv_::ReleaseStringUTFChars
                ((JNIEnv_ *)CONCAT44(local_4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98,
                 (char *)0x11bc0a);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SWIGEXPORT jint JNICALL Java_fr_limsi_wapiti_WapitiJNI_runWapiti(JNIEnv *jenv, jclass jcls, jstring jarg1) {
  jint jresult = 0 ;
  char *arg1 = (char *) 0 ;
  int result;
  
  (void)jenv;
  (void)jcls;
  arg1 = 0;
  if (jarg1) {
    arg1 = (char *)jenv->GetStringUTFChars(jarg1, 0);
    if (!arg1) return 0;
  }
  {
    try {
      result = (int)runWapiti(arg1); 
    }
    catch (char *e) {
      {
        SWIG_JavaException(jenv, SWIG_RuntimeError, e); return 0; 
      }; 
    }
    catch (const char *e) {
      {
        SWIG_JavaException(jenv, SWIG_RuntimeError, (char*)e); return 0; 
      }; 
    }
  }
  jresult = (jint)result; 
  if (arg1) jenv->ReleaseStringUTFChars(jarg1, (const char *)arg1);
  return jresult;
}